

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseBlanketJSCoverage::LoadCoverageData
          (cmParseBlanketJSCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  char *local_208 [4];
  string path;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Found ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," Files");
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0x8e,local_208[0],this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  lVar4 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(files->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(files->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Reading JSON File ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    ((long)&(((files->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar4));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
                 ,0x92,local_208[0],this->Coverage->Quiet);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::string
              ((string *)&local_1c8,
               (string *)
               ((long)&(((files->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    ReadJSONFile(this,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    lVar4 = lVar4 + 0x20;
  }
  std::__cxx11::string::~string((string *)&path);
  return true;
}

Assistant:

bool cmParseBlanketJSCoverage::LoadCoverageData(std::vector<std::string> files)
  {
  size_t i=0;
  std::string path;
      cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
       "Found " << files.size() <<" Files" << std::endl, this->Coverage.Quiet);
  for(i=0;i<files.size();i++)
    {
    cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
       "Reading JSON File " << files[i]  << std::endl, this->Coverage.Quiet);

    if(!this->ReadJSONFile(files[i]))
      {
      return false;
      }
    }
  return true;
  }